

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

uint __thiscall Model::texture_from_file(Model *this,char *file_path)

{
  pointer pcVar1;
  long *plVar2;
  ostream *poVar3;
  stbi_uc *retval_from_stbi_load;
  long *plVar4;
  GLint GVar5;
  uint uVar6;
  long *local_88;
  uint texture;
  long local_78;
  long lStack_70;
  char *local_68;
  string file_name;
  int img_width;
  long local_38 [2];
  GLsizei local_28;
  int local_24;
  int img_height;
  int nr_channels;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,file_path,(allocator<char> *)&local_88);
  pcVar1 = (this->directory)._M_dataplus._M_p;
  file_name.field_2._8_8_ = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&file_name.field_2 + 8),pcVar1,
             pcVar1 + (this->directory)._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)((long)&file_name.field_2 + 8),_img_width,0,'\x01');
  plVar2 = (long *)std::__cxx11::string::_M_append
                             (file_name.field_2._M_local_buf + 8,(ulong)local_68);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar2;
  }
  _texture = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((long *)file_name.field_2._8_8_ != local_38) {
    operator_delete((void *)file_name.field_2._8_8_,local_38[0] + 1);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_68,(long)file_name._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  (*glad_glGenTextures)(1,(GLuint *)&local_88);
  retval_from_stbi_load =
       stbi_load(local_68,(int *)(file_name.field_2._M_local_buf + 8),&local_28,&local_24,0);
  if (retval_from_stbi_load == (stbi_uc *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to load image data!\n",0x1b);
    uVar6 = 1;
    stbi_image_free((void *)0x0);
  }
  else {
    (*glad_glBindTexture)(0xde1,(GLuint)local_88);
    GVar5 = 0x1903;
    if (local_24 != 1) {
      GVar5 = (local_24 == 4) + 0x1907;
    }
    (*glad_glTexImage2D)
              (0xde1,0,GVar5,(GLsizei)file_name.field_2._8_8_,local_28,0,GVar5,0x1401,
               retval_from_stbi_load);
    (*glad_glGenerateMipmap)(0xde1);
    (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
    (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2703);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
    stbi_image_free(retval_from_stbi_load);
    uVar6 = (uint)local_88;
  }
  if ((size_type *)local_68 != &file_name._M_string_length) {
    operator_delete(local_68,file_name._M_string_length + 1);
  }
  return uVar6;
}

Assistant:

unsigned int Model::texture_from_file(const char *file_path) {
  std::string file_name = std::string(file_path);
  file_name = directory + '/' + file_name;
  std::cout << file_name << std::endl;

  unsigned int texture;
  glGenTextures(1, &texture);

  // rgb image has 3 channels : r,g,b
  int img_width, img_height, nr_channels;
  unsigned char *img_data = stbi_load(file_name.c_str(), &img_width,
                                      &img_height, &nr_channels, 0);

  if (!img_data) {
    std::cerr << "Failed to load image data!\n";
    stbi_image_free(img_data);
    return 1;
  }

  GLenum format = GL_RGB;
  if (nr_channels == 1)
    format = GL_RED;
  else if (nr_channels == 4)
    format = GL_RGBA;

  glBindTexture(GL_TEXTURE_2D, texture);
  glTexImage2D(GL_TEXTURE_2D, 0, format, img_width, img_height, 0, format,
               GL_UNSIGNED_BYTE, img_data);
  glGenerateMipmap(GL_TEXTURE_2D); // only base mipmap generated since

  // set repeeat parameters for the texture on S and T axes
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);

  // set filtering methods to mip maps (maginification/minification)
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,
                  GL_LINEAR_MIPMAP_LINEAR);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,
                  GL_LINEAR); // come back later, parameter might be mistake

  stbi_image_free(img_data);
  return texture;
}